

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

GLFWbool pollJoystickEvents(_GLFWjoystickLinux *js)

{
  int *piVar1;
  ssize_t sVar2;
  undefined1 local_20 [4];
  short local_1c;
  byte local_1a;
  byte local_19;
  js_event e;
  _GLFWjoystickLinux *js_local;
  
  e = (js_event)js;
  _glfwPollJoystickEvents();
  if (*(int *)e == 0) {
    js_local._4_4_ = 0;
  }
  else {
    while( true ) {
      piVar1 = __errno_location();
      *piVar1 = 0;
      sVar2 = read(*(int *)((long)e + 4),local_20,8);
      if (sVar2 < 0) break;
      local_1a = local_1a & 0x7f;
      if (local_1a == 2) {
        *(float *)(*(long *)((long)e + 8) + (ulong)local_19 * 4) = (float)(int)local_1c / 32767.0;
      }
      else if (local_1a == 1) {
        *(bool *)(*(long *)((long)e + 0x18) + (ulong)local_19) = local_1c != 0;
      }
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0x13) {
      free(*(void **)((long)e + 8));
      free(*(void **)((long)e + 0x18));
      free(*(void **)((long)e + 0x28));
      free(*(void **)((long)e + 0x30));
      memset((void *)e,0,0x38);
      _glfwInputJoystickChange((int)(((long)e + -0x1374a8) / 0x38),0x40002);
    }
    js_local._4_4_ = *(GLFWbool *)e;
  }
  return js_local._4_4_;
}

Assistant:

static GLFWbool pollJoystickEvents(_GLFWjoystickLinux* js)
{
#if defined(__linux__)
    _glfwPollJoystickEvents();

    if (!js->present)
        return GLFW_FALSE;

    // Read all queued events (non-blocking)
    for (;;)
    {
        struct js_event e;

        errno = 0;
        if (read(js->fd, &e, sizeof(e)) < 0)
        {
            // Reset the joystick slot if the device was disconnected
            if (errno == ENODEV)
            {
                free(js->axes);
                free(js->buttons);
                free(js->name);
                free(js->path);

                memset(js, 0, sizeof(_GLFWjoystickLinux));

                _glfwInputJoystickChange(js - _glfw.linux_js.js,
                                         GLFW_DISCONNECTED);
            }

            break;
        }

        // Clear the initial-state bit
        e.type &= ~JS_EVENT_INIT;

        if (e.type == JS_EVENT_AXIS)
            js->axes[e.number] = (float) e.value / 32767.0f;
        else if (e.type == JS_EVENT_BUTTON)
            js->buttons[e.number] = e.value ? GLFW_PRESS : GLFW_RELEASE;
    }
#endif // __linux__
    return js->present;
}